

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderTextureFunctionTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::ShaderTextureFunctionCase::initShaderSources
          (ShaderTextureFunctionCase *this)

{
  Function function_00;
  TextureType TVar1;
  byte bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  DataType dataType;
  char *pcVar6;
  char *pcVar7;
  TextureFormat format;
  ostream *poVar8;
  char *pcVar9;
  char *local_3f0;
  int local_3d8;
  byte local_3d2;
  bool local_3d1;
  string local_3c0 [32];
  string local_3a0 [32];
  char *local_380;
  char *lodBias;
  char *texCoord;
  ostringstream *op;
  undefined1 local_358 [8];
  ostringstream frag;
  ostringstream vert;
  char *local_58;
  char *funcExt;
  char *baseFuncName;
  DataType samplerType;
  TextureFormat texFmt;
  char *coordPrecName;
  char *coordTypeName;
  Precision coordPrec;
  DataType coordType;
  int extraCoordComps;
  int texCoordComps;
  bool hasLodBias;
  bool is2DProj4;
  bool isProj;
  bool isVtxCase;
  Function function;
  ShaderTextureFunctionCase *this_local;
  
  function_00 = (this->m_lookupSpec).function;
  bVar2 = (this->super_ShaderRenderCase).m_isVertexCase & 1;
  bVar3 = anon_unknown_1::functionHasProj(function_00);
  local_3d1 = false;
  if ((this->m_textureSpec).type == TEXTURETYPE_2D) {
    local_3d1 = function_00 == FUNCTION_TEXTUREPROJ || function_00 == FUNCTION_TEXTUREPROJLOD;
  }
  bVar4 = anon_unknown_1::functionHasLod((this->m_lookupSpec).function);
  local_3d2 = 1;
  if (!bVar4) {
    local_3d2 = (this->m_lookupSpec).useBias;
  }
  local_3d2 = local_3d2 & 1;
  iVar5 = 3;
  if ((this->m_textureSpec).type == TEXTURETYPE_2D) {
    iVar5 = 2;
  }
  if (bVar3) {
    local_3d8 = 1;
    if (local_3d1) {
      local_3d8 = 2;
    }
  }
  else {
    local_3d8 = 0;
  }
  dataType = glu::getDataTypeFloatVec(iVar5 + local_3d8);
  pcVar6 = glu::getDataTypeName(dataType);
  pcVar7 = glu::getPrecisionName(PRECISION_MEDIUMP);
  format = glu::mapGLTransferFormat((this->m_textureSpec).format,(this->m_textureSpec).dataType);
  baseFuncName._4_4_ = TYPE_LAST;
  pcVar9 = "textureCube";
  if ((this->m_textureSpec).type == TEXTURETYPE_2D) {
    pcVar9 = "texture2D";
  }
  local_58 = (char *)0x0;
  TVar1 = (this->m_textureSpec).type;
  if (TVar1 == TEXTURETYPE_2D) {
    baseFuncName._4_4_ = glu::getSampler2DType(format);
  }
  else if (TVar1 == TEXTURETYPE_CUBE_MAP) {
    baseFuncName._4_4_ = glu::getSamplerCubeType(format);
  }
  switch((this->m_lookupSpec).function) {
  case FUNCTION_TEXTURE:
    local_58 = "";
    break;
  case FUNCTION_TEXTUREPROJ:
    local_58 = "Proj";
    break;
  case FUNCTION_TEXTUREPROJ3:
    local_58 = "Proj";
    break;
  case FUNCTION_TEXTURELOD:
    local_58 = "Lod";
    break;
  case FUNCTION_TEXTUREPROJLOD:
    local_58 = "ProjLod";
    break;
  case FUNCTION_TEXTUREPROJLOD3:
    local_58 = "ProjLod";
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&frag.field_0x170);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_358);
  if (bVar2 == 0) {
    local_3f0 = local_358;
  }
  else {
    local_3f0 = &frag.field_0x170;
  }
  texCoord = local_3f0;
  poVar8 = std::operator<<((ostream *)&frag.field_0x170,"attribute highp vec4 a_position;\n");
  poVar8 = std::operator<<(poVar8,"attribute ");
  poVar8 = std::operator<<(poVar8,pcVar7);
  poVar8 = std::operator<<(poVar8," ");
  poVar8 = std::operator<<(poVar8,pcVar6);
  std::operator<<(poVar8," a_in0;\n");
  if (local_3d2 != 0) {
    poVar8 = std::operator<<((ostream *)&frag.field_0x170,"attribute ");
    poVar8 = std::operator<<(poVar8,pcVar7);
    std::operator<<(poVar8," float a_in1;\n");
  }
  if (bVar2 == 0) {
    poVar8 = std::operator<<((ostream *)&frag.field_0x170,"varying ");
    poVar8 = std::operator<<(poVar8,pcVar7);
    poVar8 = std::operator<<(poVar8," ");
    poVar8 = std::operator<<(poVar8,pcVar6);
    std::operator<<(poVar8," v_texCoord;\n");
    poVar8 = std::operator<<((ostream *)local_358,"varying ");
    poVar8 = std::operator<<(poVar8,pcVar7);
    poVar8 = std::operator<<(poVar8," ");
    poVar8 = std::operator<<(poVar8,pcVar6);
    std::operator<<(poVar8," v_texCoord;\n");
    if (local_3d2 != 0) {
      poVar8 = std::operator<<((ostream *)&frag.field_0x170,"varying ");
      poVar8 = std::operator<<(poVar8,pcVar7);
      std::operator<<(poVar8," float v_lodBias;\n");
      poVar8 = std::operator<<((ostream *)local_358,"varying ");
      poVar8 = std::operator<<(poVar8,pcVar7);
      std::operator<<(poVar8," float v_lodBias;\n");
    }
  }
  else {
    std::operator<<((ostream *)&frag.field_0x170,"varying mediump vec4 v_color;\n");
    std::operator<<((ostream *)local_358,"varying mediump vec4 v_color;\n");
  }
  poVar8 = std::operator<<((ostream *)texCoord,"uniform lowp ");
  pcVar6 = glu::getDataTypeName(baseFuncName._4_4_);
  poVar8 = std::operator<<(poVar8,pcVar6);
  std::operator<<(poVar8," u_sampler;\n");
  poVar8 = std::operator<<((ostream *)&frag.field_0x170,"\nvoid main()\n{\n");
  std::operator<<(poVar8,"\tgl_Position = a_position;\n");
  std::operator<<((ostream *)local_358,"\nvoid main()\n{\n");
  if (bVar2 == 0) {
    std::operator<<((ostream *)local_358,"\tgl_FragColor = ");
  }
  else {
    std::operator<<((ostream *)&frag.field_0x170,"\tv_color = ");
  }
  lodBias = "v_texCoord";
  if (bVar2 != 0) {
    lodBias = "a_in0";
  }
  local_380 = "v_lodBias";
  if (bVar2 != 0) {
    local_380 = "a_in1";
  }
  poVar8 = std::operator<<((ostream *)texCoord,pcVar9);
  std::operator<<(poVar8,local_58);
  poVar8 = std::operator<<((ostream *)texCoord,"(u_sampler, ");
  std::operator<<(poVar8,lodBias);
  bVar3 = anon_unknown_1::functionHasLod(function_00);
  if ((bVar3) || (((this->m_lookupSpec).useBias & 1U) != 0)) {
    poVar8 = std::operator<<((ostream *)texCoord,", ");
    std::operator<<(poVar8,local_380);
  }
  std::operator<<((ostream *)texCoord,");\n");
  if (bVar2 == 0) {
    std::operator<<((ostream *)&frag.field_0x170,"\tv_texCoord = a_in0;\n");
    if (local_3d2 != 0) {
      std::operator<<((ostream *)&frag.field_0x170,"\tv_lodBias = a_in1;\n");
    }
  }
  else {
    std::operator<<((ostream *)local_358,"\tgl_FragColor = v_color;\n");
  }
  std::operator<<((ostream *)&frag.field_0x170,"}\n");
  std::operator<<((ostream *)local_358,"}\n");
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::operator=
            ((string *)&(this->super_ShaderRenderCase).m_vertShaderSource,local_3a0);
  std::__cxx11::string::~string(local_3a0);
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::operator=
            ((string *)&(this->super_ShaderRenderCase).m_fragShaderSource,local_3c0);
  std::__cxx11::string::~string(local_3c0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_358);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&frag.field_0x170);
  return;
}

Assistant:

void ShaderTextureFunctionCase::initShaderSources (void)
{
	Function			function			= m_lookupSpec.function;
	bool				isVtxCase			= m_isVertexCase;
	bool				isProj				= functionHasProj(function);
	bool				is2DProj4			= m_textureSpec.type == TEXTURETYPE_2D && (function == FUNCTION_TEXTUREPROJ || function == FUNCTION_TEXTUREPROJLOD);
	bool				hasLodBias			= functionHasLod(m_lookupSpec.function) || m_lookupSpec.useBias;
	int					texCoordComps		= m_textureSpec.type == TEXTURETYPE_2D ? 2 : 3;
	int					extraCoordComps		= isProj ? (is2DProj4 ? 2 : 1) : 0;
	glu::DataType		coordType			= glu::getDataTypeFloatVec(texCoordComps+extraCoordComps);
	glu::Precision		coordPrec			= glu::PRECISION_MEDIUMP;
	const char*			coordTypeName		= glu::getDataTypeName(coordType);
	const char*			coordPrecName		= glu::getPrecisionName(coordPrec);
	tcu::TextureFormat	texFmt				= glu::mapGLTransferFormat(m_textureSpec.format, m_textureSpec.dataType);
	glu::DataType		samplerType			= glu::TYPE_LAST;
	const char*			baseFuncName		= m_textureSpec.type == TEXTURETYPE_2D ? "texture2D" : "textureCube";
	const char*			funcExt				= DE_NULL;

	switch (m_textureSpec.type)
	{
		case TEXTURETYPE_2D:		samplerType = glu::getSampler2DType(texFmt);		break;
		case TEXTURETYPE_CUBE_MAP:	samplerType = glu::getSamplerCubeType(texFmt);		break;
		default:
			DE_ASSERT(DE_FALSE);
	}

	switch (m_lookupSpec.function)
	{
		case FUNCTION_TEXTURE:			funcExt = "";			break;
		case FUNCTION_TEXTUREPROJ:		funcExt = "Proj";		break;
		case FUNCTION_TEXTUREPROJ3:		funcExt = "Proj";		break;
		case FUNCTION_TEXTURELOD:		funcExt = "Lod";		break;
		case FUNCTION_TEXTUREPROJLOD:	funcExt = "ProjLod";	break;
		case FUNCTION_TEXTUREPROJLOD3:	funcExt = "ProjLod";	break;
		default:
			DE_ASSERT(DE_FALSE);
	}

	std::ostringstream	vert;
	std::ostringstream	frag;
	std::ostringstream&	op		= isVtxCase ? vert : frag;

	vert << "attribute highp vec4 a_position;\n"
		 << "attribute " << coordPrecName << " " << coordTypeName << " a_in0;\n";

	if (hasLodBias)
		vert << "attribute " << coordPrecName << " float a_in1;\n";

	if (isVtxCase)
	{
		vert << "varying mediump vec4 v_color;\n";
		frag << "varying mediump vec4 v_color;\n";
	}
	else
	{
		vert << "varying " << coordPrecName << " " << coordTypeName << " v_texCoord;\n";
		frag << "varying " << coordPrecName << " " << coordTypeName << " v_texCoord;\n";

		if (hasLodBias)
		{
			vert << "varying " << coordPrecName << " float v_lodBias;\n";
			frag << "varying " << coordPrecName << " float v_lodBias;\n";
		}
	}

	// Uniforms
	op << "uniform lowp " << glu::getDataTypeName(samplerType) << " u_sampler;\n";

	vert << "\nvoid main()\n{\n"
		 << "\tgl_Position = a_position;\n";
	frag << "\nvoid main()\n{\n";

	if (isVtxCase)
		vert << "\tv_color = ";
	else
		frag << "\tgl_FragColor = ";

	// Op.
	{
		const char*	texCoord	= isVtxCase ? "a_in0" : "v_texCoord";
		const char*	lodBias		= isVtxCase ? "a_in1" : "v_lodBias";

		op << baseFuncName << funcExt;
		op << "(u_sampler, " << texCoord;

		if (functionHasLod(function) || m_lookupSpec.useBias)
			op << ", " << lodBias;

		op << ");\n";
	}

	if (isVtxCase)
		frag << "\tgl_FragColor = v_color;\n";
	else
	{
		vert << "\tv_texCoord = a_in0;\n";

		if (hasLodBias)
			vert << "\tv_lodBias = a_in1;\n";
	}

	vert << "}\n";
	frag << "}\n";

	m_vertShaderSource = vert.str();
	m_fragShaderSource = frag.str();
}